

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iface.c
# Opt level: O0

int nn_iface_resolve(char *addr,size_t addrlen,int ipv4only,sockaddr_storage *result,
                    size_t *resultlen)

{
  int iVar1;
  char *pcVar2;
  long in_RSI;
  char *in_RDI;
  int rc;
  undefined4 in_stack_00000028;
  size_t in_stack_00000040;
  char *in_stack_00000048;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  FILE *__stream;
  int local_4;
  
  if ((in_RSI == 1) && (*in_RDI == '*')) {
    nn_iface_any((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                 (sockaddr_storage *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (size_t *)0x152da4);
    local_4 = 0;
  }
  else {
    iVar1 = nn_literal_resolve(in_stack_00000048,in_stack_00000040,addr._4_4_,
                               (sockaddr_storage *)addrlen,
                               (size_t *)CONCAT44(ipv4only,in_stack_00000028));
    if (iVar1 == -0x16) {
      local_4 = -0x13;
    }
    else {
      if (iVar1 != 0) {
        nn_backtrace_print();
        __stream = _stderr;
        pcVar2 = nn_err_strerror(in_stack_ffffffffffffffbc);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/utils/iface.c"
                ,0x3a);
        fflush(_stderr);
        nn_err_abort();
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int nn_iface_resolve (const char *addr, size_t addrlen, int ipv4only,
    struct sockaddr_storage *result, size_t *resultlen)
{
    int rc;

    /*  Asterisk is a special name meaning "all interfaces". */
    if (addrlen == 1 && addr [0] == '*') {
        nn_iface_any (ipv4only, result, resultlen);
        return 0;
    }

    rc = nn_literal_resolve (addr, addrlen, ipv4only, result, resultlen);
    if (rc == -EINVAL)
        return -ENODEV;
    errnum_assert (rc == 0, -rc);
    return 0;
}